

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_get_array_name(Integer g_a,char *array_name)

{
  size_t sVar1;
  char *in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer in_stack_00000188;
  char *in_stack_00000190;
  
  if (GA[in_RDI + 1000].actv == 1) {
    pnga_error(in_stack_00000190,in_stack_00000188);
  }
  sVar1 = strlen(in_RSI);
  if (0x1f < sVar1) {
    pnga_error(in_stack_00000190,in_stack_00000188);
  }
  strcpy(in_RSI,GA[in_RDI + 1000].name);
  return;
}

Assistant:

void pnga_get_array_name(Integer g_a, char *array_name)
{
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot get array name on array that has not been allocated",0);
  if (strlen(array_name) > FNAM)
    pnga_error("Array name exceeds maximum array name length",FNAM);
  strcpy(array_name, GA[ga_handle].name);
}